

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O0

void __thiscall cmCMakePresetsGraph::TestPreset::TestPreset(TestPreset *this)

{
  TestPreset *this_local;
  
  Preset::Preset(&this->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__TestPreset_014991c8;
  std::__cxx11::string::string((string *)&this->ConfigurePreset);
  std::optional<bool>::optional(&this->InheritConfigureEnvironment);
  std::__cxx11::string::string((string *)&this->Configuration);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OverwriteConfigurationFile);
  std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::optional(&this->Output);
  std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::optional(&this->Filter);
  std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::optional(&this->Execution);
  return;
}

Assistant:

TestPreset() = default;